

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strncat.c
# Opt level: O2

int main(void)

{
  char cVar1;
  char cVar2;
  size_t sVar3;
  char s [10];
  
  s[0] = 'x';
  s[1] = 'x';
  s[2] = '\0';
  s[3] = 'x';
  s[4] = 'x';
  s[5] = 'x';
  s[6] = 'x';
  s[7] = 'x';
  s[8] = 'x';
  s[9] = '\0';
  sVar3 = strlen(s);
  builtin_strncpy(s + sVar3,"abcde",6);
  if (s[2] != 'a') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x2b,"s[2] == \'a\'");
  }
  if (s[6] != 'e') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x2c,"s[6] == \'e\'");
  }
  if (s[7] != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x2d,"s[7] == \'\\0\'");
  }
  if (s[8] != 'x') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x2e,"s[8] == \'x\'");
  }
  s._0_8_ = s._0_8_ & 0xffffffffffffff00;
  sVar3 = strlen(s);
  builtin_strncpy(s + sVar3,"abcdx",6);
  if (s[4] != 'x') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x31,"s[4] == \'x\'");
  }
  cVar1 = s[5];
  if (s[5] != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x32,"s[5] == \'\\0\'");
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x34,"s[5] == \'\\0\'");
  }
  cVar2 = s[6];
  if (s[6] != 'e') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x35,"s[6] == \'e\'");
  }
  if (cVar1 != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x37,"s[5] == \'\\0\'");
  }
  if (cVar2 != 'e') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x38,"s[6] == \'e\'");
  }
  strncat(s,"abcde",3);
  if (s[5] != 'a') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x3a,"s[5] == \'a\'");
  }
  if (s[7] != 'c') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x3b,"s[7] == \'c\'");
  }
  if (s[8] != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x3c,"s[8] == \'\\0\'");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    char s[] = "xx\0xxxxxx";
    TESTCASE( strncat( s, abcde, 10 ) == s );
    TESTCASE( s[2] == 'a' );
    TESTCASE( s[6] == 'e' );
    TESTCASE( s[7] == '\0' );
    TESTCASE( s[8] == 'x' );
    s[0] = '\0';
    TESTCASE( strncat( s, abcdx, 10 ) == s );
    TESTCASE( s[4] == 'x' );
    TESTCASE( s[5] == '\0' );
    TESTCASE( strncat( s, "\0", 10 ) == s );
    TESTCASE( s[5] == '\0' );
    TESTCASE( s[6] == 'e' );
    TESTCASE( strncat( s, abcde, 0 ) == s );
    TESTCASE( s[5] == '\0' );
    TESTCASE( s[6] == 'e' );
    TESTCASE( strncat( s, abcde, 3 ) == s );
    TESTCASE( s[5] == 'a' );
    TESTCASE( s[7] == 'c' );
    TESTCASE( s[8] == '\0' );
    return TEST_RESULTS;
}